

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid2d_refinement_pattern.cc
# Opt level: O0

size_type __thiscall
lf::refinement::Hybrid2DRefinementPattern::NumChildren(Hybrid2DRefinementPattern *this,dim_t codim)

{
  RefPat RVar1;
  RefElType RVar2;
  dim_t dVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  string local_17f0;
  allocator<char> local_17c9;
  string local_17c8;
  allocator<char> local_17a1;
  string local_17a0;
  stringstream local_1780 [8];
  stringstream ss_11;
  ostream local_1770 [376];
  string local_15f8;
  allocator<char> local_15d1;
  string local_15d0;
  allocator<char> local_15a9;
  string local_15a8;
  stringstream local_1588 [8];
  stringstream ss_10;
  ostream local_1578 [376];
  string local_1400;
  allocator<char> local_13d9;
  string local_13d8;
  allocator<char> local_13b1;
  string local_13b0;
  stringstream local_1390 [8];
  stringstream ss_9;
  ostream local_1380 [376];
  string local_1208;
  allocator<char> local_11e1;
  string local_11e0;
  allocator<char> local_11b9;
  string local_11b8;
  stringstream local_1198 [8];
  stringstream ss_8;
  ostream local_1188 [376];
  string local_1010;
  allocator<char> local_fe9;
  string local_fe8;
  allocator<char> local_fc1;
  string local_fc0;
  stringstream local_fa0 [8];
  stringstream ss_7;
  ostream local_f90 [376];
  string local_e18;
  allocator<char> local_df1;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  stringstream local_da8 [8];
  stringstream ss_6;
  ostream local_d98 [376];
  string local_c20;
  allocator<char> local_bf9;
  string local_bf8;
  allocator<char> local_bd1;
  string local_bd0;
  stringstream local_bb0 [8];
  stringstream ss_5;
  ostream local_ba0 [376];
  string local_a28;
  allocator<char> local_a01;
  string local_a00;
  allocator<char> local_9d9;
  string local_9d8;
  stringstream local_9b8 [8];
  stringstream ss_4;
  ostream local_9a8 [376];
  string local_830;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  stringstream local_7c0 [8];
  stringstream ss_3;
  ostream local_7b0 [376];
  string local_638;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  stringstream local_5c8 [8];
  stringstream ss_2;
  ostream local_5b8 [376];
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  stringstream local_3d0 [8];
  stringstream ss_1;
  ostream local_3c0 [376];
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  dim_t local_1c;
  Hybrid2DRefinementPattern *pHStack_18;
  dim_t codim_local;
  Hybrid2DRefinementPattern *this_local;
  
  local_1c = codim;
  pHStack_18 = this;
  dVar3 = lf::base::RefEl::Dimension(&(this->super_RefinementPattern).ref_el_);
  if (dVar3 < codim) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar4 = std::operator<<(local_198,"Illegal codim = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
    poVar4 = std::operator<<(poVar4," for ");
    lf::base::RefEl::ToString_abi_cxx11_(&local_1d8,&(this->super_RefinementPattern).ref_el_);
    std::operator<<(poVar4,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"codim <= ref_el_.Dimension()",&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
               ,&local_221);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1f8,&local_220,0x34,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&(this->super_RefinementPattern).ref_el_);
  switch(RVar2) {
  case kPoint:
    if (this->ref_pat_ == rp_nil) {
      this_local._4_4_ = 0;
    }
    else {
      if (this->ref_pat_ != rp_copy) {
        std::__cxx11::stringstream::stringstream(local_3d0);
        std::operator<<(local_3c0,"Illegal refinement pattern for point");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"false",&local_3f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,&local_419);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_3f0,&local_418,0x40,&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::string::~string((string *)&local_418);
        std::allocator<char>::~allocator(&local_419);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this_local._4_4_ = 1;
    }
    break;
  case kSegment:
    if (local_1c == 0) {
      RVar1 = this->ref_pat_;
      if (RVar1 == rp_nil) {
        this_local._4_4_ = 0;
      }
      else if (RVar1 == rp_copy) {
        this_local._4_4_ = 1;
      }
      else {
        if (RVar1 != rp_split) {
          std::__cxx11::stringstream::stringstream(local_5c8);
          poVar4 = std::operator<<(local_5b8,"refinement pattern ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->ref_pat_);
          std::operator<<(poVar4,"not implemented for edge!");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e8,"false",&local_5e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                     ,&local_611);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_5e8,&local_610,0x55,&local_638);
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)&local_610);
          std::allocator<char>::~allocator(&local_611);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::allocator<char>::~allocator(&local_5e9);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"this code should not be reached");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this_local._4_4_ = 2;
      }
    }
    else {
      if (local_1c != 1) {
        std::__cxx11::stringstream::stringstream(local_9b8);
        std::operator<<(local_9a8,"invalid codim");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"false",&local_9d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a00,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,&local_a01);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_9d8,&local_a00,0x6e,&local_a28);
        std::__cxx11::string::~string((string *)&local_a28);
        std::__cxx11::string::~string((string *)&local_a00);
        std::allocator<char>::~allocator(&local_a01);
        std::__cxx11::string::~string((string *)&local_9d8);
        std::allocator<char>::~allocator(&local_9d9);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (this->ref_pat_ < rp_split) {
        this_local._4_4_ = 0;
      }
      else {
        if (this->ref_pat_ != rp_split) {
          std::__cxx11::stringstream::stringstream(local_7c0);
          poVar4 = std::operator<<(local_7b0,"refinement pattern ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->ref_pat_);
          std::operator<<(poVar4,"not implemented for edge!");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7e0,"false",&local_7e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_808,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                     ,&local_809);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_7e0,&local_808,0x67,&local_830);
          std::__cxx11::string::~string((string *)&local_830);
          std::__cxx11::string::~string((string *)&local_808);
          std::allocator<char>::~allocator(&local_809);
          std::__cxx11::string::~string((string *)&local_7e0);
          std::allocator<char>::~allocator(&local_7e1);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"this code should not be reached");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this_local._4_4_ = 1;
      }
    }
    break;
  case kTria:
    if (local_1c == 0) {
      switch(this->ref_pat_) {
      case rp_nil:
        this_local._4_4_ = 0;
        break;
      case rp_copy:
        this_local._4_4_ = 1;
        break;
      default:
        std::__cxx11::stringstream::stringstream(local_bb0);
        poVar4 = std::operator<<(local_ba0,"refinement pattern ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->ref_pat_);
        std::operator<<(poVar4,"not implemented for triangle!");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd0,"false",&local_bd1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_bf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,&local_bf9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_bd0,&local_bf8,0x8d,&local_c20);
        std::__cxx11::string::~string((string *)&local_c20);
        std::__cxx11::string::~string((string *)&local_bf8);
        std::allocator<char>::~allocator(&local_bf9);
        std::__cxx11::string::~string((string *)&local_bd0);
        std::allocator<char>::~allocator(&local_bd1);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case rp_bisect:
        this_local._4_4_ = 2;
        break;
      case rp_trisect:
      case rp_trisect_left:
        this_local._4_4_ = 3;
        break;
      case rp_quadsect:
      case rp_regular:
        this_local._4_4_ = 4;
        break;
      case rp_barycentric:
        this_local._4_4_ = 6;
      }
    }
    else if (local_1c == 1) {
      switch(this->ref_pat_) {
      case rp_nil:
      case rp_copy:
        this_local._4_4_ = 0;
        break;
      default:
        std::__cxx11::stringstream::stringstream(local_fa0);
        poVar4 = std::operator<<(local_f90,"refinement pattern ");
        poVar4 = refinement::operator<<(poVar4,&this->ref_pat_);
        std::operator<<(poVar4,"not implemented for triangle!");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc0,"false",&local_fc1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fe8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,&local_fe9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_fc0,&local_fe8,0xac,&local_1010);
        std::__cxx11::string::~string((string *)&local_1010);
        std::__cxx11::string::~string((string *)&local_fe8);
        std::allocator<char>::~allocator(&local_fe9);
        std::__cxx11::string::~string((string *)&local_fc0);
        std::allocator<char>::~allocator(&local_fc1);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case rp_bisect:
        this_local._4_4_ = 1;
        break;
      case rp_trisect:
      case rp_trisect_left:
        this_local._4_4_ = 2;
        break;
      case rp_quadsect:
      case rp_regular:
        this_local._4_4_ = 3;
        break;
      case rp_barycentric:
        this_local._4_4_ = 6;
      }
    }
    else {
      if (local_1c != 2) {
        std::__cxx11::stringstream::stringstream(local_da8);
        std::operator<<(local_d98,"invalid codim");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_dc8,"false",&local_dc9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_df0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,&local_df1);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_dc8,&local_df0,0x93,&local_e18);
        std::__cxx11::string::~string((string *)&local_e18);
        std::__cxx11::string::~string((string *)&local_df0);
        std::allocator<char>::~allocator(&local_df1);
        std::__cxx11::string::~string((string *)&local_dc8);
        std::allocator<char>::~allocator(&local_dc9);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (this->ref_pat_ == rp_barycentric) {
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    break;
  case kQuad:
    if (local_1c == 0) {
      switch(this->ref_pat_) {
      case rp_nil:
        this_local._4_4_ = 0;
        break;
      case rp_copy:
        this_local._4_4_ = 1;
        break;
      case rp_split:
      case rp_bisect:
        this_local._4_4_ = 2;
        break;
      case rp_trisect:
        this_local._4_4_ = 3;
        break;
      default:
        std::__cxx11::stringstream::stringstream(local_1198);
        poVar4 = std::operator<<(local_1188,"refinement pattern ");
        poVar4 = refinement::operator<<(poVar4,&this->ref_pat_);
        std::operator<<(poVar4,"not implemented for quadrilateral!");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11b8,"false",&local_11b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,&local_11e1);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_11b8,&local_11e0,0xd7,&local_1208);
        std::__cxx11::string::~string((string *)&local_1208);
        std::__cxx11::string::~string((string *)&local_11e0);
        std::allocator<char>::~allocator(&local_11e1);
        std::__cxx11::string::~string((string *)&local_11b8);
        std::allocator<char>::~allocator(&local_11b9);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case rp_quadsect:
        this_local._4_4_ = 4;
        break;
      case rp_threeedge:
      case rp_regular:
      case rp_barycentric:
        this_local._4_4_ = 4;
      }
    }
    else if (local_1c == 1) {
      switch(this->ref_pat_) {
      case rp_nil:
      case rp_copy:
        this_local._4_4_ = 0;
        break;
      case rp_split:
      case rp_bisect:
        this_local._4_4_ = 1;
        break;
      case rp_trisect:
        this_local._4_4_ = 2;
        break;
      default:
        std::__cxx11::stringstream::stringstream(local_1390);
        poVar4 = std::operator<<(local_1380,"refinement pattern ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->ref_pat_);
        std::operator<<(poVar4,"not implemented for quadrilateral!");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_13b0,"false",&local_13b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_13d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,&local_13d9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_13b0,&local_13d8,0xf7,&local_1400);
        std::__cxx11::string::~string((string *)&local_1400);
        std::__cxx11::string::~string((string *)&local_13d8);
        std::allocator<char>::~allocator(&local_13d9);
        std::__cxx11::string::~string((string *)&local_13b0);
        std::allocator<char>::~allocator(&local_13b1);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case rp_quadsect:
        this_local._4_4_ = 3;
        break;
      case rp_threeedge:
        this_local._4_4_ = 3;
        break;
      case rp_regular:
      case rp_barycentric:
        this_local._4_4_ = 4;
      }
    }
    else {
      if (local_1c != 2) {
        std::__cxx11::stringstream::stringstream(local_1588);
        std::operator<<(local_1578,"invalid codim");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_15a8,"false",&local_15a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_15d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,&local_15d1);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_15a8,&local_15d0,0x106,&local_15f8);
        std::__cxx11::string::~string((string *)&local_15f8);
        std::__cxx11::string::~string((string *)&local_15d0);
        std::allocator<char>::~allocator(&local_15d1);
        std::__cxx11::string::~string((string *)&local_15a8);
        std::allocator<char>::~allocator(&local_15a9);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((this->ref_pat_ == rp_barycentric) || (this->ref_pat_ == rp_regular)) {
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1780);
    std::operator<<(local_1770,"unsupported RefEl");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_17a0,"false",&local_17a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_17c8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
               ,&local_17c9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_17a0,&local_17c8,0x10b,&local_17f0);
    std::__cxx11::string::~string((string *)&local_17f0);
    std::__cxx11::string::~string((string *)&local_17c8);
    std::allocator<char>::~allocator(&local_17c9);
    std::__cxx11::string::~string((string *)&local_17a0);
    std::allocator<char>::~allocator(&local_17a1);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return this_local._4_4_;
}

Assistant:

lf::base::size_type Hybrid2DRefinementPattern::NumChildren(
    lf::base::dim_t codim) const {
  LF_VERIFY_MSG(codim <= ref_el_.Dimension(),
                "Illegal codim = " << codim << " for " << ref_el_.ToString());
  // Depending on the type of cell do something different
  switch (ref_el_) {
    case lf::base::RefEl::kPoint(): {
      switch (ref_pat_) {
        case RefPat::rp_nil: {
          return 0;
        }
        case RefPat::rp_copy: {
          return 1;
        }
        default: {
          LF_VERIFY_MSG(false, "Illegal refinement pattern for point");
        }
      }  // end swtich ref_pat
      break;
    }  // end case of a simple point
    case lf::base::RefEl::kSegment(): {
      switch (codim) {
        case 0: {
          switch (ref_pat_) {
            case RefPat::rp_nil: {
              return 0;
            }
            case RefPat::rp_copy: {
              return 1;
            }
            case RefPat::rp_split: {
              return 2;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << (int)ref_pat_
                                       << "not implemented for edge!");
              break;
            }
          }  // end switch ref_pat
          break;
        }
        case 1: {
          switch (ref_pat_) {
            case RefPat::rp_nil:
            case RefPat::rp_copy: {
              return 0;
            }
            case RefPat::rp_split: {
              return 1;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << (int)ref_pat_
                                       << "not implemented for edge!");
              break;
            }
          }  // end switch ref_pat
          break;
        }
        default:
          LF_VERIFY_MSG(false, "invalid codim");
      }  // end switch codim
      break;
    }  // end case of an edge
    case lf::base::RefEl::kTria(): {
      switch (codim) {
        case 0: {
          switch (ref_pat_) {
            case RefPat::rp_nil: {
              return 0;
            }
            case RefPat::rp_copy: {
              return 1;
            }
            case RefPat::rp_bisect: {
              return 2;
            }
            case RefPat::rp_trisect:
            case RefPat::rp_trisect_left: {
              return 3;
            }
            case RefPat::rp_quadsect:
            case RefPat::rp_regular: {
              return 4;
            }
            case RefPat::rp_barycentric: {
              return 6;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << (int)ref_pat_
                                       << "not implemented for triangle!");
              break;
            }
          }  // end switch ref_pat
          break;
          default:
            LF_VERIFY_MSG(false, "invalid codim");
        }  // end case codim = 0
        case 1: {
          switch (ref_pat_) {
            case RefPat::rp_nil:
            case RefPat::rp_copy: {
              return 0;
            }
            case RefPat::rp_bisect: {
              return 1;
            }
            case RefPat::rp_trisect:
            case RefPat::rp_trisect_left: {
              return 2;
            }
            case RefPat::rp_quadsect:
            case RefPat::rp_regular: {
              return 3;
            }
            case RefPat::rp_barycentric: {
              return 6;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << ref_pat_
                                       << "not implemented for triangle!");
              break;
            }
          }  // end switch ref_pat
          break;
        }  // end case codim = 1
        case 2: {
          if (ref_pat_ == RefPat::rp_barycentric) {
            return 1;
          }
          return 0;
        }
      }  // end switch codim
      break;
    }  // end case of a triangle
    case lf::base::RefEl::kQuad(): {
      switch (codim) {
        case 0: {
          switch (ref_pat_) {
            case RefPat::rp_nil: {
              return 0;
            }
            case RefPat::rp_copy: {
              return 1;
            }
            case RefPat::rp_trisect: {
              return 3;
            }
            case RefPat::rp_quadsect: {
              return 4;
            }
            case RefPat::rp_bisect:
            case RefPat::rp_split: {
              return 2;
            }
            case RefPat::rp_threeedge:
            case RefPat::rp_barycentric:
            case RefPat::rp_regular: {
              return 4;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << ref_pat_
                                       << "not implemented for quadrilateral!");
              break;
            }
          }  // end switch ref_pat
          break;
        }
        case 1: {
          switch (ref_pat_) {
            case RefPat::rp_nil:
            case RefPat::rp_copy: {
              return 0;
            }
            case RefPat::rp_trisect: {
              return 2;
            }
            case RefPat::rp_quadsect: {
              return 3;
            }
            case RefPat::rp_bisect:
            case RefPat::rp_split: {
              return 1;
            }
            case RefPat::rp_threeedge: {
              return 3;
            }
            case RefPat::rp_barycentric:
            case RefPat::rp_regular: {
              return 4;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << (int)ref_pat_
                                       << "not implemented for quadrilateral!");
              break;
            }
          }  // end switch ref_pat
          break;
        }
        case 2: {
          if ((ref_pat_ == RefPat::rp_barycentric) ||
              (ref_pat_ == RefPat::rp_regular)) {
            return 1;
          }
          return 0;
          break;
        }
        default:
          LF_VERIFY_MSG(false, "invalid codim");
      }  // end switch codim
      break;
    }  // end case of a quadrilateral
    default:
      LF_VERIFY_MSG(false, "unsupported RefEl");
  }  // end switch cell type
  return 0;
}